

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.h
# Opt level: O0

S2Point * __thiscall S2CellId::ToPoint(S2Point *__return_storage_ptr__,S2CellId *this)

{
  S2Point local_28;
  S2CellId *local_10;
  S2CellId *this_local;
  
  local_10 = this;
  ToPointRaw(&local_28,this);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
            (__return_storage_ptr__,(BasicVector<Vector3,_double,_3UL> *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

S2Point ToPoint() const { return ToPointRaw().Normalize(); }